

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O3

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CNewArrayExpression *exp)

{
  IExpression *pIVar1;
  bool bVar2;
  TypeInfo *in_RCX;
  string errorMessage;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  char local_70 [8];
  char local_68 [24];
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"typechecker: CNewArrayExpression\n",0x21);
  pIVar1 = (exp->lengthExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  if (pIVar1 != (IExpression *)0x0) {
    (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
    TypeInfo::TypeInfo((TypeInfo *)local_80,ERROR_TYPE);
    bVar2 = operator==(&this->lastCalculatedType,(TypeInfo *)local_80);
    if (local_78._M_p != local_68) {
      operator_delete(local_78._M_p);
    }
    if (bVar2) {
      return;
    }
  }
  TypeInfo::TypeInfo((TypeInfo *)local_80,INT);
  bVar2 = operator!=(&this->lastCalculatedType,(TypeInfo *)local_80);
  if (local_78._M_p != local_68) {
    operator_delete(local_78._M_p);
  }
  if (bVar2) {
    TypeInfo::TypeInfo((TypeInfo *)local_80,INT);
    CError::GetTypeErrorMessage_abi_cxx11_
              (&local_50,(CError *)local_80,&this->lastCalculatedType,in_RCX);
    if (local_78._M_p != local_68) {
      operator_delete(local_78._M_p);
    }
    CError::CError((CError *)local_80,&local_50,
                   &(exp->super_IExpression).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_80);
    if (local_80 != (undefined1  [8])local_70) {
      operator_delete((void *)local_80);
    }
    TypeInfo::TypeInfo((TypeInfo *)local_80,ERROR_TYPE);
    (this->lastCalculatedType).isPrimitive = (bool)local_80[0];
    *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_80._1_3_;
    (this->lastCalculatedType).type = local_80._4_4_;
    std::__cxx11::string::operator=
              ((string *)&(this->lastCalculatedType).className,(string *)&local_78);
    if (local_78._M_p != local_68) {
      operator_delete(local_78._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return;
    }
  }
  else {
    TypeInfo::TypeInfo((TypeInfo *)local_80,INT_ARRAY);
    (this->lastCalculatedType).isPrimitive = (bool)local_80[0];
    *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_80._1_3_;
    (this->lastCalculatedType).type = local_80._4_4_;
    std::__cxx11::string::operator=
              ((string *)&(this->lastCalculatedType).className,(string *)&local_78);
    local_50._M_dataplus._M_p = local_78._M_p;
    if (local_78._M_p == local_68) {
      return;
    }
  }
  operator_delete(local_50._M_dataplus._M_p);
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CNewArrayExpression &exp )
{
    std::cout << "typechecker: CNewArrayExpression\n";

    if ( exp.lengthExpression ) {
		exp.lengthExpression->Accept( *this );
        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
	}
	if( lastCalculatedType != enums::TPrimitiveType::INT ) {
		auto errorMessage = CError::GetTypeErrorMessage( enums::TPrimitiveType::INT, lastCalculatedType );
		errors.push_back( CError( errorMessage, exp.position ) );
        lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
        return;
	}
    lastCalculatedType = enums::TPrimitiveType::INT_ARRAY;
}